

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void __thiscall
ON_SubDEdge::CopyFrom
          (ON_SubDEdge *this,ON_SubDEdge *src,bool bReverseEdge,bool bCopyVertexArray,
          bool bCopyFaceArray,bool bCopySymmetrySetNext)

{
  uchar *puVar1;
  ON_SubDFacePtr *pOVar2;
  ON_SubDFacePtr *pOVar3;
  ushort uVar4;
  long lVar5;
  ON_SubDEdge *pOVar6;
  ON_SubDEdge *pOVar7;
  ulong uVar8;
  undefined7 in_register_00000089;
  
  if (src == (ON_SubDEdge *)0x0) {
    src = &Empty;
  }
  pOVar6 = src;
  pOVar7 = this;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar7->super_ON_SubDComponentBase).m_subd_point1 =
         (pOVar6->super_ON_SubDComponentBase).m_subd_point1;
    pOVar6 = (ON_SubDEdge *)&(pOVar6->super_ON_SubDComponentBase).m_id;
    pOVar7 = (ON_SubDEdge *)&(pOVar7->super_ON_SubDComponentBase).m_id;
  }
  (this->super_ON_SubDComponentBase).m_subd_point1 = (ON_SubDVertex *)0x0;
  puVar1 = &(this->super_ON_SubDComponentBase).m_saved_points_flags;
  *puVar1 = *puVar1 & 0x43;
  if ((int)CONCAT71(in_register_00000089,bCopySymmetrySetNext) != 0) {
    (this->super_ON_SubDComponentBase).m_symmetry_set_next.m_ptr =
         (src->super_ON_SubDComponentBase).m_symmetry_set_next.m_ptr;
  }
  this->m_next_edge = (ON_SubDEdge *)0x0;
  this->m_edge_tag = src->m_edge_tag;
  *(undefined8 *)(this->m_sharpness).m_edge_sharpness =
       *(undefined8 *)(src->m_sharpness).m_edge_sharpness;
  if (bCopyVertexArray) {
    this->m_vertex[0] = src->m_vertex[bReverseEdge];
    uVar8 = (ulong)!bReverseEdge;
    this->m_vertex[1] = src->m_vertex[uVar8];
  }
  else {
    uVar8 = (ulong)!bReverseEdge;
  }
  this->m_sector_coefficient[0] = src->m_sector_coefficient[bReverseEdge];
  this->m_sector_coefficient[1] = src->m_sector_coefficient[uVar8];
  if (!bCopyFaceArray) {
    return;
  }
  uVar4 = src->m_face_count;
  if (uVar4 != 0) {
    if (uVar4 < 3) {
      this->m_face2[0].m_ptr = src->m_face2[0].m_ptr;
      this->m_face2[1].m_ptr = src->m_face2[1].m_ptr;
      goto LAB_005cb3f3;
    }
    pOVar2 = src->m_facex;
    pOVar3 = this->m_facex;
    if (pOVar3 != (ON_SubDFacePtr *)0x0 && pOVar2 != (ON_SubDFacePtr *)0x0) {
      this->m_face2[0].m_ptr = src->m_face2[0].m_ptr;
      this->m_face2[1].m_ptr = src->m_face2[1].m_ptr;
      uVar8 = 0;
      do {
        pOVar3[uVar8].m_ptr = pOVar2[uVar8].m_ptr;
        uVar8 = uVar8 + 1;
      } while (uVar4 - 2 != uVar8);
      goto LAB_005cb3f3;
    }
  }
  uVar4 = 0;
LAB_005cb3f3:
  this->m_face_count = uVar4;
  return;
}

Assistant:

void ON_SubDEdge::CopyFrom(
  const ON_SubDEdge* src,
  bool bReverseEdge,
  bool bCopyVertexArray,
  bool bCopyFaceArray,
  bool bCopySymmetrySetNext
)
{
  if (nullptr == src)
    src = &ON_SubDEdge::Empty;

  CopyBaseFrom(src, bCopySymmetrySetNext);

  m_next_edge = nullptr;
  
  m_edge_tag = src->m_edge_tag;

  m_sharpness = src->m_sharpness;

  unsigned int end0 = bReverseEdge ? 1 : 0;

  if (bCopyVertexArray)
  {
    m_vertex[0] = src->m_vertex[end0];
    m_vertex[1] = src->m_vertex[1 - end0];
  }

  m_sector_coefficient[0] = src->m_sector_coefficient[end0];
  m_sector_coefficient[1] = src->m_sector_coefficient[1 - end0];

  if (bCopyFaceArray)
  {
    if (src->m_face_count > 0 && (src->m_face_count <= 2 || (nullptr != src->m_facex && nullptr != m_facex)))
    {
      m_face2[0] = src->m_face2[0];
      m_face2[1] = src->m_face2[1];
      unsigned int face_count = src->m_face_count;
      if (face_count > 2)
      {
        face_count -= 2;
        for (unsigned int efi = 0; efi < face_count; efi++)
          m_facex[efi] = src->m_facex[efi];
      }
      m_face_count = src->m_face_count;
    }
    else
      m_face_count = 0;
  }
}